

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void sysbvm_context_setIntrinsicTypeMetadata
               (sysbvm_context_t *context,sysbvm_tuple_t type,char *name,sysbvm_tuple_t supertype,
               ...)

{
  size_t array;
  char in_AL;
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t value;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sysbvm_tuple_t *local_1e0;
  int *local_1c8;
  undefined8 *local_1b0;
  long *local_160;
  long local_148 [4];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  sysbvm_tuple_t local_90;
  sysbvm_tuple_t slotType;
  sysbvm_tuple_t flags;
  sysbvm_tuple_t slotName;
  size_t i;
  sysbvm_tuple_t slots;
  sysbvm_tuple_t actualSupertype;
  size_t supertypeTotalSlotCount;
  va_list valist;
  sysbvm_tuple_t local_38;
  size_t slotNameCount;
  sysbvm_tuple_t nameSymbol;
  sysbvm_tuple_t supertype_local;
  char *name_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  local_128 = in_R8;
  local_120 = in_R9;
  sVar2 = sysbvm_symbol_internWithCString(context,name);
  if (supertype != 0) {
    sysbvm_type_setSupertype(type,supertype);
  }
  sysbvm_namespace_setNewSymbolBindingWithValue(context,(context->roots).globalNamespace,sVar2,type)
  ;
  sysbvm_orderedCollection_add(context,(context->roots).intrinsicTypes,type);
  local_38 = 0;
  valist[0].overflow_arg_area = local_148;
  valist[0]._0_8_ = &stack0x00000008;
  supertypeTotalSlotCount._4_4_ = 0x30;
  supertypeTotalSlotCount._0_4_ = 0x20;
  while( true ) {
    if ((uint)supertypeTotalSlotCount < 0x29) {
      local_160 = (long *)((long)valist[0].overflow_arg_area +
                          (long)(int)(uint)supertypeTotalSlotCount);
      supertypeTotalSlotCount._0_4_ = (uint)supertypeTotalSlotCount + 8;
    }
    else {
      local_160 = (long *)valist[0]._0_8_;
      valist[0]._0_8_ = valist[0]._0_8_ + 8;
    }
    if (*local_160 == 0) break;
    if ((uint)supertypeTotalSlotCount < 0x29) {
      supertypeTotalSlotCount._0_4_ = (uint)supertypeTotalSlotCount + 8;
    }
    else {
      valist[0]._0_8_ = valist[0]._0_8_ + 8;
    }
    if ((uint)supertypeTotalSlotCount < 0x29) {
      supertypeTotalSlotCount._0_4_ = (uint)supertypeTotalSlotCount + 8;
    }
    else {
      valist[0]._0_8_ = valist[0]._0_8_ + 8;
    }
    local_38 = local_38 + 1;
  }
  actualSupertype = 0;
  slots = sysbvm_type_getSupertype(type);
  _Var1 = sysbvm_tuple_isNonNullPointer(slots);
  if (_Var1) {
    actualSupertype = sysbvm_type_getTotalSlotCount(slots);
  }
  i = sysbvm_array_create(context,local_38);
  valist[0].overflow_arg_area = local_148;
  valist[0]._0_8_ = &stack0x00000008;
  supertypeTotalSlotCount._4_4_ = 0x30;
  supertypeTotalSlotCount._0_4_ = 0x20;
  for (slotName = 0; slotName < local_38; slotName = slotName + 1) {
    if ((uint)supertypeTotalSlotCount < 0x29) {
      local_1b0 = (undefined8 *)
                  ((long)(int)(uint)supertypeTotalSlotCount + (long)valist[0].overflow_arg_area);
      supertypeTotalSlotCount._0_4_ = (uint)supertypeTotalSlotCount + 8;
    }
    else {
      local_1b0 = (undefined8 *)valist[0]._0_8_;
      valist[0]._0_8_ = valist[0]._0_8_ + 8;
    }
    flags = sysbvm_symbol_internWithCString(context,(char *)*local_1b0);
    if ((uint)supertypeTotalSlotCount < 0x29) {
      local_1c8 = (int *)((long)(int)(uint)supertypeTotalSlotCount +
                         (long)valist[0].overflow_arg_area);
      supertypeTotalSlotCount._0_4_ = (uint)supertypeTotalSlotCount + 8;
    }
    else {
      local_1c8 = (int *)valist[0]._0_8_;
      valist[0]._0_8_ = valist[0]._0_8_ + 8;
    }
    slotType = sysbvm_tuple_bitflags_encode((long)*local_1c8);
    array = i;
    sVar2 = slotName;
    if ((uint)supertypeTotalSlotCount < 0x29) {
      local_1e0 = (sysbvm_tuple_t *)
                  ((long)(int)(uint)supertypeTotalSlotCount + (long)valist[0].overflow_arg_area);
      supertypeTotalSlotCount._0_4_ = (uint)supertypeTotalSlotCount + 8;
    }
    else {
      local_1e0 = (sysbvm_tuple_t *)valist[0]._0_8_;
      valist[0]._0_8_ = valist[0]._0_8_ + 8;
    }
    local_90 = *local_1e0;
    if (local_90 == 0) {
      local_90 = (context->roots).anyValueType;
    }
    value = sysbvm_typeSlot_create
                      (context,type,flags,slotType,local_90,slotName,actualSupertype + slotName);
    sysbvm_array_atPut(array,sVar2,value);
  }
  sysbvm_type_setSlots(type,i);
  sysbvm_type_setTotalSlotCount(context,type,actualSupertype + local_38);
  sysbvm_type_buildSlotDictionary(context,type);
  return;
}

Assistant:

static void sysbvm_context_setIntrinsicTypeMetadata(sysbvm_context_t *context, sysbvm_tuple_t type, const char *name, sysbvm_tuple_t supertype, ...)
{
    sysbvm_tuple_t nameSymbol = sysbvm_symbol_internWithCString(context, name);
    if(supertype)
        sysbvm_type_setSupertype(type, supertype);
    sysbvm_namespace_setNewSymbolBindingWithValue(context, context->roots.globalNamespace, nameSymbol, type);
    sysbvm_orderedCollection_add(context, context->roots.intrinsicTypes, type);

    // First pass: count the arguments.
    size_t slotNameCount = 0;
    va_list valist;
    va_start(valist, supertype);
    while(va_arg(valist, const char *))
    {
        va_arg(valist, sysbvm_typeSlotFlags_t);
        va_arg(valist, int);
        ++slotNameCount;
    }
    va_end(valist);

    // Second pass: make the argument list.
    size_t supertypeTotalSlotCount = 0;
    sysbvm_tuple_t actualSupertype = sysbvm_type_getSupertype(type);
    if(sysbvm_tuple_isNonNullPointer(actualSupertype))
        supertypeTotalSlotCount = sysbvm_type_getTotalSlotCount(actualSupertype);

    sysbvm_tuple_t slots = sysbvm_array_create(context, slotNameCount);
    va_start(valist, supertype);
    for(size_t i = 0; i < slotNameCount; ++i)
    {
        sysbvm_tuple_t slotName = sysbvm_symbol_internWithCString(context, va_arg(valist, const char *));
        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(va_arg(valist, int));
        sysbvm_tuple_t slotType = va_arg(valist, sysbvm_tuple_t);
        if(!slotType)
            slotType = context->roots.anyValueType;
        sysbvm_array_atPut(slots, i, sysbvm_typeSlot_create(context, type, slotName, flags, slotType, i, supertypeTotalSlotCount + i));
    }

    va_end(valist);
    sysbvm_type_setSlots(type, slots);
    sysbvm_type_setTotalSlotCount(context, type, supertypeTotalSlotCount + slotNameCount);
    sysbvm_type_buildSlotDictionary(context, type);
}